

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qfsfileengine.cpp
# Opt level: O1

bool __thiscall QFSFileEnginePrivate::closeFdFh(QFSFileEnginePrivate *this)

{
  QAbstractFileEngine *this_00;
  byte bVar1;
  int iVar2;
  int iVar3;
  int *piVar4;
  byte bVar5;
  long in_FS_OFFSET;
  bool bVar6;
  QString local_40;
  long local_28;
  
  local_28 = *(long *)(in_FS_OFFSET + 0x28);
  if (this->fd != -1 || this->fh != (FILE *)0x0) {
    this_00 = (this->super_QAbstractFileEnginePrivate).q_ptr;
    if (this->fh == (FILE *)0x0) {
      bVar5 = 0;
    }
    else {
      bVar5 = 1;
      if (this->lastFlushFailed == false) {
        iVar2 = (*this_00->_vptr_QAbstractFileEngine[4])(this_00);
        bVar5 = (byte)iVar2 ^ 1;
      }
    }
    this->field_0xc2 = this->field_0xc2 & 0xfb;
    if (this->closeFileHandle == true) {
      if ((FILE *)this->fh == (FILE *)0x0) {
        iVar2 = this->fd;
        do {
          iVar3 = close(iVar2);
          if (iVar3 != -1) goto LAB_0014a424;
          piVar4 = __errno_location();
        } while (*piVar4 == 4);
        iVar3 = 1;
      }
      else {
        iVar3 = fclose((FILE *)this->fh);
      }
LAB_0014a424:
      this->fh = (FILE *)0x0;
      this->fd = -1;
      bVar6 = iVar3 != 0;
    }
    else {
      bVar6 = false;
    }
    bVar1 = (bVar6 | bVar5) ^ 1;
    if (bVar5 != 0 || bVar1 != 0) goto LAB_0014a449;
    piVar4 = __errno_location();
    QSystemError::stdString(&local_40,*piVar4);
    QAbstractFileEngine::setError(this_00,UnspecifiedError,&local_40);
    if (&(local_40.d.d)->super_QArrayData != (QArrayData *)0x0) {
      LOCK();
      ((local_40.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
           ((local_40.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i + -1;
      UNLOCK();
      if (((local_40.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i == 0) {
        QArrayData::deallocate(&(local_40.d.d)->super_QArrayData,2,0x10);
      }
    }
  }
  bVar1 = 0;
LAB_0014a449:
  if (*(long *)(in_FS_OFFSET + 0x28) == local_28) {
    return (bool)bVar1;
  }
  __stack_chk_fail();
}

Assistant:

bool QFSFileEnginePrivate::closeFdFh()
{
    Q_Q(QFSFileEngine);
    if (fd == -1 && !fh)
        return false;

    // Flush the file if it's buffered, and if the last flush didn't fail.
    bool flushed = !fh || (!lastFlushFailed && q->flush());
    bool closed = true;
    tried_stat = 0;

    // Close the file if we created the handle.
    if (closeFileHandle) {
        int ret;

        if (fh) {
            // Close buffered file.
            ret = fclose(fh);
        } else {
            // Close unbuffered file.
            ret = QT_CLOSE(fd);
        }

        // We must reset these guys regardless; calling close again after a
        // failed close causes crashes on some systems.
        fh = nullptr;
        fd = -1;
        closed = (ret == 0);
    }

    // Report errors.
    if (!flushed || !closed) {
        if (flushed) {
            // If not flushed, we want the flush error to fall through.
            q->setError(QFile::UnspecifiedError, QSystemError::stdString(errno));
        }
        return false;
    }

    return true;
}